

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bank.cpp
# Opt level: O3

int __thiscall Bank::getRate(Bank *this,string *src,string *dst)

{
  size_t __n;
  size_t __n_00;
  int iVar1;
  runtime_error *this_00;
  
  __n = src->_M_string_length;
  __n_00 = dst->_M_string_length;
  if (__n == __n_00) {
    if (__n == 0) {
      return 1;
    }
    iVar1 = bcmp((src->_M_dataplus)._M_p,(dst->_M_dataplus)._M_p,__n);
    if (iVar1 == 0) {
      return 1;
    }
  }
  if (((__n == (this->source)._M_string_length) &&
      (((__n == 0 ||
        (iVar1 = bcmp((src->_M_dataplus)._M_p,(this->source)._M_dataplus._M_p,__n), iVar1 == 0)) &&
       (__n_00 == (this->to)._M_string_length)))) &&
     ((__n_00 == 0 ||
      (iVar1 = bcmp((dst->_M_dataplus)._M_p,(this->to)._M_dataplus._M_p,__n_00), iVar1 == 0)))) {
    return this->rate;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unknown rate");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int Bank::getRate(const string &src, const string &dst) const
{
	if (src == dst) {
		return 1;
	}
	if (src != source || dst != to) {
		throw runtime_error("Unknown rate");
	}
	return rate;
}